

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

int cfd::core::ConstantNonceFunction
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,uchar *xonly_pk32,void *data)

{
  void *data_local;
  uchar *xonly_pk32_local;
  uchar *algo16_local;
  uchar *key32_local;
  uchar *msg32_local;
  uchar *nonce32_local;
  
  *(undefined8 *)nonce32 = *data;
  *(undefined8 *)(nonce32 + 8) = *(undefined8 *)((long)data + 8);
  *(undefined8 *)(nonce32 + 0x10) = *(undefined8 *)((long)data + 0x10);
  *(undefined8 *)(nonce32 + 0x18) = *(undefined8 *)((long)data + 0x18);
  return 1;
}

Assistant:

int ConstantNonceFunction(
    unsigned char *nonce32, const unsigned char *msg32,
    const unsigned char *key32, const unsigned char *algo16,
    const unsigned char *xonly_pk32, void *data) {
  (void)msg32;
  (void)key32;
  (void)algo16;
  (void)xonly_pk32;
  std::memcpy(nonce32, (const unsigned char *)data, 32);
  return 1;
}